

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::PrintSubdomain(TPZMHMeshControl *this,int64_t elindex,ostream *out)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  TPZCompEl **ppTVar4;
  TPZGeoEl *pTVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  TPZCompEl *pTVar8;
  long *plVar9;
  long lVar10;
  _Self __tmp;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> interfaces;
  set<long,_std::less<long>,_std::allocator<long>_> celindices;
  TPZStack<TPZCompElSide,_10> boundaries;
  long local_170;
  undefined **local_168;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_160;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_130;
  pair<long,_long> local_100;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  lVar10 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
           fNElements;
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = &PTR__TPZManVector_018424d8;
  lVar3 = 0x28;
  do {
    *(undefined8 *)((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar3 + -0x28)
         = 0;
    *(undefined4 *)
     ((long)&(((TPZManVector<TPZCompElSide,_10> *)
              (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
             super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar3) = 0xffffffff;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 200);
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
       local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01842198;
  local_170 = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar10) {
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,local_170);
      pTVar8 = *ppTVar4;
      pTVar5 = TPZCompEl::Reference(pTVar8);
      if (pTVar5 != (TPZGeoEl *)0x0) {
        if ((this->fGeoToMHMDomain).super_TPZVec<long>.fStore[pTVar5->fIndex] == elindex) {
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&local_130,&local_170);
          AddElementBoundaries(this,elindex,local_170,&local_f0);
        }
        lVar3 = __dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
        if (lVar3 != 0) {
          pTVar8 = *(TPZCompEl **)(lVar3 + 0x28);
          pTVar5 = TPZCompEl::Reference(pTVar8);
          bVar2 = IsSibling(this,pTVar5->fIndex,elindex);
          if (bVar2) {
            local_100.first = pTVar8->fIndex;
            local_100.second = local_170;
            std::
            _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
            ::_M_emplace_equal<std::pair<long,long>>
                      ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                        *)&local_160,&local_100);
          }
        }
      }
      local_170 = local_170 + 1;
    } while (local_170 < lVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Diagnostics for subdomain formed by element seed ",0x31);
  poVar6 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Number of computational elements contained in the group ",0x38);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Comp Element indices ",0x15);
  p_Var7 = local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_130._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_130._M_impl.super__Rb_tree_header) {
    do {
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_130._M_impl.super__Rb_tree_header);
  }
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of boundary interfaces ",0x1e);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  p_Var7 = local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_160._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_160._M_impl.super__Rb_tree_header) {
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,(int64_t)p_Var7[1]._M_parent);
      if (*ppTVar4 == (TPZCompEl *)0x0) {
        pTVar8 = (TPZCompEl *)0x0;
      }
      else {
        pTVar8 = (TPZCompEl *)
                 __dynamic_cast(*ppTVar4,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
      }
      if (pTVar8 == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x39a);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"Comp Element index ",0x13);
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," side ",6);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)&pTVar8[1].fMesh);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," skeleton element ",0x12);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," interface index ",0x11);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," face material id ",0x12);
      pTVar5 = TPZCompEl::Reference(pTVar8);
      plVar9 = (long *)std::ostream::operator<<(poVar6,pTVar5->fMatId);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_160._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Number of elements on the sides of elseed ",0x2a);
  poVar6 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements) {
    lVar10 = 0;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Comp Element index ",0x13);
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," side ",6);
      plVar9 = (long *)std::ostream::operator<<
                                 (poVar6,*(int *)((long)&(local_f0.
                                                  super_TPZManVector<TPZCompElSide,_10>.
                                                  super_TPZVec<TPZCompElSide>.fStore)->fSide +
                                                 lVar10));
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      lVar3 = lVar3 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar3 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                     fNElements);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Geom Element indices ",0x15);
  p_Var7 = local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_130._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_130._M_impl.super__Rb_tree_header) {
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,*(int64_t *)(p_Var7 + 1));
      TPZCompEl::Reference(*ppTVar4);
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_130._M_impl.super__Rb_tree_header);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of boundary interfaces ",0x1e);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  p_Var7 = local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_160._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_160._M_impl.super__Rb_tree_header) {
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,(int64_t)p_Var7[1]._M_parent);
      if (*ppTVar4 == (TPZCompEl *)0x0) {
        pTVar8 = (TPZCompEl *)0x0;
      }
      else {
        pTVar8 = (TPZCompEl *)
                 __dynamic_cast(*ppTVar4,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
      }
      if (pTVar8 == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x3ae);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"Geom Element index ",0x13);
      TPZCompEl::Reference(*(TPZCompEl **)(pTVar8 + 1));
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," side ",6);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)&pTVar8[1].fMesh);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," skeleton element ",0x12);
      TPZCompEl::Reference((TPZCompEl *)pTVar8[1].fIndex);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," interface index ",0x11);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," face material id ",0x12);
      pTVar5 = TPZCompEl::Reference(pTVar8);
      plVar9 = (long *)std::ostream::operator<<(poVar6,pTVar5->fMatId);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_160._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Number of elements on the sides of elseed ",0x2a);
  poVar6 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements) {
    lVar3 = 0;
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Geom Element index ",0x13);
      TPZCompEl::Reference
                (*(TPZCompEl **)
                  ((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar3));
      poVar6 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," side ",6);
      plVar9 = (long *)std::ostream::operator<<
                                 (poVar6,*(int *)((long)&(local_f0.
                                                  super_TPZManVector<TPZCompElSide,_10>.
                                                  super_TPZVec<TPZCompElSide>.fStore)->fSide + lVar3
                                                 ));
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar10 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fNElements);
  }
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore ==
      local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
         (TPZCompElSide *)0x0;
  }
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0183b970;
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
      (TPZCompElSide *)0x0) {
    operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_160);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_130);
  return;
}

Assistant:

void TPZMHMeshControl::PrintSubdomain(int64_t elindex, std::ostream &out)
{
    int64_t nel = fCMesh->NElements();
    std::set<int64_t> celindices;
    std::multimap<int64_t,int64_t> interfaces;
    TPZStack<TPZCompElSide> boundaries;
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int64_t gelindex = gel->Index();
        if(fGeoToMHMDomain[gelindex] == elindex)
        {
            celindices.insert(el);
            // verify whether their neighbours are in the subdomain
            AddElementBoundaries(elindex, el, boundaries);
        }
        TPZInterfaceElement *iface = dynamic_cast<TPZInterfaceElement *>(cel);
        if (iface) {
            TPZCompEl *left = iface->LeftElement();
            TPZGeoEl *gleft = left->Reference();
            if (IsSibling(gleft->Index(), elindex)) {
                interfaces.insert(std::make_pair(left->Index(),el));
            }
        }
    }
    out << "Diagnostics for subdomain formed by element seed " << elindex << std::endl;
    out << "Number of computational elements contained in the group " << celindices.size() << std::endl;
    out << "Comp Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << *i << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Comp Element index " << face->LeftElement()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Index() << " interface index "
            << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Comp Element index " << boundaries[i].Element()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
    out << "Geom Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << fCMesh->ElementVec()[*i]->Reference()->Index() << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Geom Element index " << face->LeftElement()->Reference()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Reference()->Index() << " interface index "
        << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Geom Element index " << boundaries[i].Element()->Reference()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
}